

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_while::translate
          (method_while *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  compiler_type *this_00;
  token_base *ptVar1;
  _Elt_pointer pdVar2;
  int iVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  bool *pbVar6;
  statement_while *this_01;
  _Elt_pointer pptVar7;
  size_t size;
  allocator_type local_1f1;
  tree_type<cs::token_base_*> local_1f0;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_178;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_128;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_d8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_88;
  _Self local_68;
  _Self local_40;
  
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  this_00 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_68._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_68._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_68._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  std::operator+(&local_40,&local_68,1);
  local_88._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_88._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_88._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_88._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&local_178,&local_40,&local_88,&local_1f1);
  compiler_type::translate(this_00,&local_178,&body);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque(&local_178);
  size = 1;
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  local_178.
  super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(*pptVar4)[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_178);
  ptVar1 = *pptVar5;
  if (ptVar1 != (token_base *)0x0) {
    iVar3 = (*ptVar1->_vptr_token_base[2])(ptVar1);
    if (iVar3 == 7) {
      pbVar6 = cs_impl::any::const_val<bool>((any *)(ptVar1 + 1));
      if (*pbVar6 == true) {
        this_01 = (statement_while *)statement_base::operator_new((statement_base *)0x70,size);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d8,
                   &body);
        std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1d8,
                   &context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
        pdVar2 = (raw->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar7 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar7 ==
            (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar7 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        statement_loop::statement_loop
                  ((statement_loop *)this_01,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d8,
                   (context_t *)&local_1d8,pptVar7[-1]);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
        std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                  (&local_d8);
      }
      else {
        this_01 = (statement_while *)0x0;
      }
      goto LAB_001818eb;
    }
  }
  this_01 = (statement_while *)statement_base::operator_new((statement_base *)0x78,size);
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  tree_type<cs::token_base_*>::tree_type(&local_1f0,(tree_type<cs::token_base_*> *)(*pptVar4 + 1));
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_128,&body)
  ;
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1e8,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  pdVar2 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar7 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar7 ==
      (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar7 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_while::statement_while
            (this_01,&local_1f0,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_128,
             (context_t *)&local_1e8,pptVar7[-1]);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_128);
  tree_type<cs::token_base_*>::~tree_type(&local_1f0);
LAB_001818eb:
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  return &this_01->super_statement_base;
}

Assistant:

statement_base *method_while::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_base *ptr = tree.root().data();
		if (ptr != nullptr && ptr->get_type() == token_types::value) {
			if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
				return new statement_loop(body, context, raw.front().back());
			else
				return nullptr;
		}
		else
			return new statement_while(static_cast<token_expr *>(raw.front().at(1))->get_tree(), body, context,
			                           raw.front().back());
	}